

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O3

void __thiscall
inja::InjaError::InjaError(InjaError *this,string *type,string *message,SourceLocation location)

{
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong __val;
  ulong *puVar7;
  ulong uVar8;
  long *plVar9;
  char cVar10;
  ulong uVar11;
  ulong __val_00;
  string __str_1;
  string __str;
  ulong *local_160;
  uint local_158;
  undefined4 uStack_154;
  ulong local_150 [2];
  ulong *local_140;
  uint local_138;
  undefined4 uStack_134;
  ulong local_130 [2];
  ulong *local_120;
  long local_118;
  ulong local_110;
  long lStack_108;
  long *local_100;
  undefined8 local_f8;
  long local_f0;
  undefined8 uStack_e8;
  long *local_e0;
  undefined8 local_d8;
  long local_d0;
  undefined8 uStack_c8;
  string *local_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  string *local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __val_00 = location.column;
  __val = location.line;
  local_c0 = message;
  ::std::operator+(&local_50,"[inja.exception.",type);
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_50);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_a8 = *puVar7;
    lStack_a0 = plVar5[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *puVar7;
    local_b8 = (ulong *)*plVar5;
  }
  local_b0 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar10 = '\x01';
  if (9 < __val) {
    uVar8 = __val;
    cVar4 = '\x04';
    do {
      cVar10 = cVar4;
      if (uVar8 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_00158987;
      }
      if (uVar8 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_00158987;
      }
      if (uVar8 < 10000) goto LAB_00158987;
      bVar2 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar4 = cVar10 + '\x04';
    } while (bVar2);
    cVar10 = cVar10 + '\x01';
  }
LAB_00158987:
  local_140 = local_130;
  local_98 = type;
  ::std::__cxx11::string::_M_construct((ulong)&local_140,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_140,local_138,__val);
  uVar8 = CONCAT44(uStack_134,local_138) + local_b0;
  uVar11 = 0xf;
  if (local_b8 != &local_a8) {
    uVar11 = local_a8;
  }
  if (uVar11 < uVar8) {
    uVar11 = 0xf;
    if (local_140 != local_130) {
      uVar11 = local_130[0];
    }
    if (uVar11 < uVar8) goto LAB_00158a01;
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_00158a01:
    puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_140);
  }
  local_100 = &local_f0;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_f0 = *plVar5;
    uStack_e8 = puVar6[3];
  }
  else {
    local_f0 = *plVar5;
    local_100 = (long *)*puVar6;
  }
  local_f8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_100);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_110 = *puVar7;
    lStack_108 = plVar5[3];
    local_120 = &local_110;
  }
  else {
    local_110 = *puVar7;
    local_120 = (ulong *)*plVar5;
  }
  local_118 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar10 = '\x01';
  if (9 < __val_00) {
    uVar8 = __val_00;
    cVar4 = '\x04';
    do {
      cVar10 = cVar4;
      if (uVar8 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_00158b18;
      }
      if (uVar8 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_00158b18;
      }
      if (uVar8 < 10000) goto LAB_00158b18;
      bVar2 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar4 = cVar10 + '\x04';
    } while (bVar2);
    cVar10 = cVar10 + '\x01';
  }
LAB_00158b18:
  local_160 = local_150;
  ::std::__cxx11::string::_M_construct((ulong)&local_160,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_160,local_158,__val_00);
  uVar8 = CONCAT44(uStack_154,local_158) + local_118;
  uVar11 = 0xf;
  if (local_120 != &local_110) {
    uVar11 = local_110;
  }
  if (uVar11 < uVar8) {
    uVar11 = 0xf;
    if (local_160 != local_150) {
      uVar11 = local_150[0];
    }
    if (uVar8 <= uVar11) {
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,(ulong)local_120);
      goto LAB_00158b9a;
    }
  }
  puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_160);
LAB_00158b9a:
  local_e0 = &local_d0;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_d0 = *plVar5;
    uStack_c8 = puVar6[3];
  }
  else {
    local_d0 = *plVar5;
    local_e0 = (long *)*puVar6;
  }
  local_d8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_e0);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_80 = *plVar9;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar9;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(local_c0->_M_dataplus)._M_p);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_60 = *plVar9;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar9;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  ::std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0] + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if (local_140 != local_130) {
    operator_delete(local_140,local_130[0] + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  psVar3 = local_98;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__InjaError_001af248;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->type,pcVar1,pcVar1 + psVar3->_M_string_length);
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar1 = (local_c0->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar1,pcVar1 + local_c0->_M_string_length);
  (this->location).line = __val;
  (this->location).column = __val_00;
  return;
}

Assistant:

explicit InjaError(const std::string& type, const std::string& message, SourceLocation location)
      : std::runtime_error("[inja.exception." + type + "] (at " + std::to_string(location.line) + ":" + std::to_string(location.column) + ") " + message),
        type(type), message(message), location(location) {}